

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

const_iterator __thiscall Json::Value::end(Value *this)

{
  undefined1 uVar1;
  iterator this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_RDI;
  const_iterator cVar3;
  iterator local_10;
  undefined1 local_8;
  
  uVar1 = (undefined1)(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color;
  if ((uVar1 == 6 || uVar1 == 7) && (*(long *)&(in_RDI->_M_t)._M_impl != 0)) {
    this_00 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::end(in_RDI);
    ValueConstIterator::ValueConstIterator((ValueConstIterator *)this_00._M_node,(iterator *)in_RDI)
    ;
    uVar2 = extraout_RDX;
  }
  else {
    ValueConstIterator::ValueConstIterator((ValueConstIterator *)0x128d8a);
    uVar2 = extraout_RDX_00;
  }
  cVar3.super_ValueIteratorBase._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  cVar3.super_ValueIteratorBase.isNull_ = (bool)local_8;
  cVar3.super_ValueIteratorBase.current_._M_node = local_10._M_node;
  return (const_iterator)cVar3.super_ValueIteratorBase;
}

Assistant:

Value::const_iterator Value::end() const {
  switch (type_) {
  case arrayValue:
  case objectValue:
    if (value_.map_)
      return const_iterator(value_.map_->end());
    break;
  default:
    break;
  }
  return const_iterator();
}